

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_file(mbedtls_md_info_t *md_info,char *path,uchar *output)

{
  int iVar1;
  FILE *__stream;
  void *pvVar2;
  size_t sVar3;
  int iVar4;
  mbedtls_md_context_t ctx;
  uchar buf [1024];
  mbedtls_md_context_t local_458;
  uchar local_438 [1032];
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar4 = -0x5100;
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream == (FILE *)0x0) {
      iVar4 = -0x5200;
    }
    else {
      local_458.md_info = (mbedtls_md_info_t *)0x0;
      local_458.md_ctx = (void *)0x0;
      local_458.hmac_ctx = (void *)0x0;
      pvVar2 = (*md_info->ctx_alloc_func)();
      local_458.md_ctx = pvVar2;
      if (pvVar2 == (void *)0x0) {
        iVar4 = -0x5180;
      }
      else {
        local_458.md_info = md_info;
        (*md_info->starts_func)(pvVar2);
        sVar3 = fread(local_438,1,0x400,__stream);
        if (sVar3 != 0) {
          do {
            (*md_info->update_func)(pvVar2,local_438,sVar3);
            sVar3 = fread(local_438,1,0x400,__stream);
          } while (sVar3 != 0);
        }
        iVar1 = ferror(__stream);
        iVar4 = -0x5200;
        if (iVar1 == 0) {
          (*md_info->finish_func)(pvVar2,output);
          iVar4 = 0;
        }
      }
      fclose(__stream);
      mbedtls_md_free(&local_458);
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_md_file( const mbedtls_md_info_t *md_info, const char *path, unsigned char *output )
{
    int ret;
    FILE *f;
    size_t n;
    mbedtls_md_context_t ctx;
    unsigned char buf[1024];

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_MD_FILE_IO_ERROR );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
        goto cleanup;

    md_info->starts_func( ctx.md_ctx );

    while( ( n = fread( buf, 1, sizeof( buf ), f ) ) > 0 )
        md_info->update_func( ctx.md_ctx, buf, n );

    if( ferror( f ) != 0 )
    {
        ret = MBEDTLS_ERR_MD_FILE_IO_ERROR;
        goto cleanup;
    }

    md_info->finish_func( ctx.md_ctx, output );

cleanup:
    fclose( f );
    mbedtls_md_free( &ctx );

    return( ret );
}